

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int wait_for_one_process(int block)

{
  int iVar1;
  int *piVar2;
  service *psVar3;
  time_t tVar4;
  int in_EDI;
  bool bVar5;
  char tmp [128];
  command *cmd;
  listnode *node;
  time_t now;
  socketinfo *si;
  service *svc;
  int status;
  pid_t pid;
  char local_b8 [96];
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  listnode *local_30;
  socketinfo *local_20;
  uint local_10;
  uint local_c;
  int local_8;
  int local_4;
  
  local_8 = in_EDI;
  do {
    local_c = waitpid(-1,(int *)&local_10,(uint)(local_8 == 0));
    bVar5 = false;
    if (local_c == 0xffffffff) {
      piVar2 = __errno_location();
      bVar5 = *piVar2 == 4;
    }
  } while (bVar5);
  if ((int)local_c < 1) {
    local_4 = -1;
  }
  else {
    log_write(6,"<6>init: waitpid returned pid %d, status = %08x\n",(ulong)local_c,(ulong)local_10);
    psVar3 = service_find_by_pid(local_c);
    if (psVar3 == (service *)0x0) {
      log_write(3,"<3>init: untracked pid %d exited\n",(ulong)local_c);
      local_4 = 0;
    }
    else {
      log_write(5,"<5>init: process \'%s\', pid %d exited\n",psVar3->name,(ulong)local_c);
      if ((psVar3->flags & 2) == 0) {
        kill(-local_c,9);
        log_write(5,"<5>init: process \'%s\' killing any children in process group\n",psVar3->name);
      }
      for (local_20 = psVar3->sockets; local_20 != (socketinfo *)0x0; local_20 = local_20->next) {
        snprintf(local_b8,0x80,"/dev/socket/%s",local_20->name);
        unlink(local_b8);
      }
      psVar3->pid = 0;
      psVar3->flags = psVar3->flags & 0xfffffffb;
      if ((psVar3->flags & 2) != 0) {
        psVar3->flags = psVar3->flags | 1;
      }
      if ((psVar3->flags & 1) == 0) {
        tVar4 = gettime();
        if ((psVar3->flags & 0x20) != 0) {
          if (psVar3->time_crashed + 0xf0 < tVar4) {
            psVar3->time_crashed = tVar4;
            psVar3->nr_crashed = 1;
          }
          else {
            iVar1 = psVar3->nr_crashed + 1;
            psVar3->nr_crashed = iVar1;
            if (4 < iVar1) {
              log_write(3,
                        "<3>init: critical process \'%s\' exited %d times in %d minutes; rebooting into recovery mode\n"
                        ,psVar3->name,4);
              sync();
              reboot(0x1234567);
            }
          }
        }
        for (local_30 = (psVar3->onrestart).commands.next; local_30 != &(psVar3->onrestart).commands
            ; local_30 = local_30->next) {
          (*(code *)local_30[1].next)(*(undefined4 *)&local_30[1].prev,local_30 + 2);
        }
        psVar3->flags = psVar3->flags | 8;
        notify_service_state(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        local_4 = 0;
      }
      else {
        notify_service_state(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int wait_for_one_process(int block)
{
    pid_t pid;
    int status;
    struct service *svc;
    struct socketinfo *si;
    time_t now;
    struct listnode *node;
    struct command *cmd;

    while ( (pid = waitpid(-1, &status, block ? 0 : WNOHANG)) == -1 && errno == EINTR );
    if (pid <= 0) return -1;
    INFO("waitpid returned pid %d, status = %08x\n", pid, status);

    svc = service_find_by_pid(pid);
    if (!svc) {
        ERROR("untracked pid %d exited\n", pid);
        return 0;
    }

    NOTICE("process '%s', pid %d exited\n", svc->name, pid);

    if (!(svc->flags & SVC_ONESHOT)) {
        kill(-pid, SIGKILL);
        NOTICE("process '%s' killing any children in process group\n", svc->name);
    }

    /* remove any sockets we may have created */
    for (si = svc->sockets; si; si = si->next) {
        char tmp[128];
        snprintf(tmp, sizeof(tmp), ANDROID_SOCKET_DIR"/%s", si->name);
        unlink(tmp);
    }

    svc->pid = 0;
    svc->flags &= (~SVC_RUNNING);

        /* oneshot processes go into the disabled state on exit */
    if (svc->flags & SVC_ONESHOT) {
        svc->flags |= SVC_DISABLED;
    }

        /* disabled processes do not get restarted automatically */
    if (svc->flags & SVC_DISABLED) {
        notify_service_state(svc->name, "stopped");
        return 0;
    }

    now = gettime();
    if (svc->flags & SVC_CRITICAL) {
        if (svc->time_crashed + CRITICAL_CRASH_WINDOW >= now) {
            if (++svc->nr_crashed > CRITICAL_CRASH_THRESHOLD) {
                ERROR("critical process '%s' exited %d times in %d minutes; "
                      "rebooting into recovery mode\n", svc->name,
                      CRITICAL_CRASH_THRESHOLD, CRITICAL_CRASH_WINDOW / 60);
                sync();
                /*reboot(LINUX_REBOOT_MAGIC1, LINUX_REBOOT_MAGIC2,
                         LINUX_REBOOT_CMD_RESTART2, "recovery");*/
		reboot(RB_AUTOBOOT);
                return 0;
            }
        } else {
            svc->time_crashed = now;
            svc->nr_crashed = 1;
        }
    }

    /* Execute all onrestart commands for this service. */
    list_for_each(node, &svc->onrestart.commands) {
        cmd = node_to_item(node, struct command, clist);
        cmd->func(cmd->nargs, cmd->args);
    }
    svc->flags |= SVC_RESTARTING;
    notify_service_state(svc->name, "restarting");
    return 0;
}